

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O3

int ffcsum(fitsfile *fptr,long nrec,unsigned_long *sum,int *status)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  unsigned_short sbuf [1440];
  ulong local_b78 [361];
  
  iVar1 = *status;
  if (0 < nrec && iVar1 < 1) {
    lVar5 = 0;
    do {
      ffgbyt(fptr,0xb40,local_b78,status);
      ffswap2((short *)local_b78,0x5a0);
      uVar2 = *sum >> 0x10;
      auVar7 = ZEXT416((uint)*sum & 0xffff);
      lVar6 = 0;
      lVar3 = 0;
      do {
        uVar9 = *(ulong *)((long)local_b78 + lVar3 * 4);
        auVar11._8_4_ = (int)(uVar9 >> 0x20);
        auVar11._0_8_ = uVar9;
        auVar11._12_4_ = 0;
        uVar2 = uVar2 + SUB168(auVar11 & _DAT_00208b60,0);
        lVar6 = lVar6 + SUB168(auVar11 & _DAT_00208b60,8);
        auVar10._8_2_ = (short)(uVar9 >> 0x30);
        auVar10._0_8_ = uVar9 >> 0x10;
        auVar10._10_6_ = 0;
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + SUB168(auVar10 & _DAT_00208b60,0);
        auVar7._8_8_ = lVar8 + SUB168(auVar10 & _DAT_00208b60,8);
        lVar3 = lVar3 + 2;
      } while (lVar3 != 0x2d0);
      uVar9 = auVar7._8_8_ + auVar7._0_8_;
      uVar2 = lVar6 + uVar2;
      while( true ) {
        uVar4 = uVar2 >> 0x10;
        if (uVar9 >> 0x10 == 0 && uVar4 == 0) break;
        uVar2 = (uVar2 & 0xffff) + (uVar9 >> 0x10);
        uVar9 = (uVar9 & 0xffff) + uVar4;
      }
      *sum = uVar2 * 0x10000 + uVar9;
      lVar5 = lVar5 + 1;
    } while (lVar5 != nrec);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffcsum(fitsfile *fptr,      /* I - FITS file pointer                  */
           long nrec,           /* I - number of 2880-byte blocks to sum  */
           unsigned long *sum,  /* IO - accumulated checksum              */
           int *status)         /* IO - error status                      */
/*
    Calculate a 32-bit 1's complement checksum of the FITS 2880-byte blocks.
    This routine is based on the C algorithm developed by Rob
    Seaman at NOAO that was presented at the 1994 ADASS conference,  
    published in the Astronomical Society of the Pacific Conference Series.
    This uses a 32-bit 1's complement checksum in which the overflow bits
    are permuted back into the sum and therefore all bit positions are
    sampled evenly. 
*/
{
    long ii, jj;
    unsigned short sbuf[1440];
    unsigned long hi, lo, hicarry, locarry;

    if (*status > 0)
        return(*status);
  /*
    Sum the specified number of FITS 2880-byte records.  This assumes that
    the FITSIO file pointer points to the start of the records to be summed.
    Read each FITS block as 1440 short values (do byte swapping if needed).
  */
    for (jj = 0; jj < nrec; jj++)
    {
      ffgbyt(fptr, 2880, sbuf, status);

#if BYTESWAPPED

      ffswap2( (short *)sbuf, 1440); /* reverse order of bytes in each value */

#endif

      hi = (*sum >> 16);
      lo = *sum & 0xFFFF;

      for (ii = 0; ii < 1440; ii += 2)
      {
        hi += sbuf[ii];
        lo += sbuf[ii+1];
      }

      hicarry = hi >> 16;    /* fold carry bits in */
      locarry = lo >> 16;

      while (hicarry | locarry)
      {
        hi = (hi & 0xFFFF) + locarry;
        lo = (lo & 0xFFFF) + hicarry;
        hicarry = hi >> 16;
        locarry = lo >> 16;
      }

      *sum = (hi << 16) + lo;
    }
    return(*status);
}